

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O0

ReferenceElement * __thiscall
lsp::ArxmlStorage::addReference(ArxmlStorage *this,ReferenceElement *elem)

{
  reference pvVar1;
  ReferenceElement *elem_local;
  ArxmlStorage *this_local;
  
  std::deque<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>::push_back
            (&this->references_,elem);
  pvVar1 = std::deque<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>::back
                     (&this->references_);
  return pvVar1;
}

Assistant:

const lsp::ReferenceElement* lsp::ArxmlStorage::addReference(const lsp::ReferenceElement &elem)
{
    references_.push_back(elem);
    return &(references_.back());
}